

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O1

void __thiscall SDT::Stmt1::dfs(Stmt1 *this,TreeNode *treeNode,SDTNode *fa)

{
  pointer *pppSVar1;
  uint uVar2;
  iterator iVar3;
  uint __val;
  uint uVar4;
  SDTNode *pSVar5;
  SDTNode *pSVar6;
  SDTNode *pSVar7;
  uint uVar8;
  ulong uVar9;
  vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_> *pvVar10;
  iterator iVar11;
  Stmt *this_00;
  uint __len;
  undefined1 auStack_c8 [32];
  string sStack_a8;
  string sStack_88;
  string sStack_68;
  vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_> *pvStack_48;
  SDTNode *local_10;
  
  local_10 = (SDTNode *)operator_new(0x48);
  (local_10->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_10->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_10->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126be8;
  local_10[1]._vptr_SDTNode =
       (_func_int **)
       &local_10[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
        .super__Vector_impl_data._M_finish;
  local_10[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &local_10[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  local_10[2]._vptr_SDTNode = (_func_int **)0x0;
  iVar11._M_current =
       (this->super_SDTNode).sons.
       super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pvVar10 = &(this->super_SDTNode).sons;
  this_00 = (Stmt *)pvVar10;
  std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
            ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar11,&local_10);
  if ((((TreeNode *)iVar11._M_current)->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (((TreeNode *)iVar11._M_current)->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  pvStack_48 = pvVar10;
  switch(((TreeNode *)iVar11._M_current)->opt) {
  case 0:
    commonCal((TreeNode *)iVar11._M_current,(SDTNode *)iVar11._M_current,&this_00->super_SDTNode,
              (string *)&switchD_00108d3b::switchdataD_0011e028);
    return;
  case 1:
    pSVar5 = (SDTNode *)operator_new(0x88);
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar5->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126c28;
    pSVar5[1]._vptr_SDTNode =
         (_func_int **)
         &pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)&pSVar5[2]._vptr_SDTNode = 0;
    pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar5[2].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pSVar5[3].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar5[3].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar5[3].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[3].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pSVar6 = (SDTNode *)operator_new(0x78);
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar6->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126670;
    pSVar6[1]._vptr_SDTNode =
         (_func_int **)
         &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    pSVar6[2]._vptr_SDTNode =
         (_func_int **)
         &pSVar6[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar6[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar6[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    pSVar6[3]._vptr_SDTNode = (_func_int **)0x0;
    pSVar6[3].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pvVar10 = &(this_00->super_SDTNode).sons;
    iVar3._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      auStack_c8._0_8_ = pSVar5;
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar3,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar3._M_current = pSVar5;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar3._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_c8._0_8_ = pSVar6;
    if (iVar3._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar3,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar3._M_current = pSVar6;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    isl = 1;
    (**pSVar5->_vptr_SDTNode)
              (pSVar5,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      *(((TreeNode *)iVar11._M_current)->sons).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start,this_00);
    inAss = 1;
    inEval = 1;
    (**pSVar6->_vptr_SDTNode)
              (pSVar6,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (((TreeNode *)iVar11._M_current)->sons).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[2],this_00);
    inAss = 0;
    auStack_c8._0_8_ = (SDTNode *)(auStack_c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_c8,"=","");
    sStack_a8._M_dataplus._M_p = (pointer)&sStack_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a8,"_","");
    gen((string *)auStack_c8,(string *)(pSVar6 + 2),&sStack_a8,(string *)&pSVar5[2].sons);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
      operator_delete(sStack_a8._M_dataplus._M_p,sStack_a8.field_2._M_allocated_capacity + 1);
    }
    if ((SDTNode *)auStack_c8._0_8_ == (SDTNode *)(auStack_c8 + 0x10)) {
      return;
    }
    break;
  case 4:
    Stmt::dfs(this_00);
  case 3:
    Stmt::dfs(this_00);
  case 2:
    pSVar5 = (SDTNode *)operator_new(0x78);
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar5->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126670;
    pSVar5[1]._vptr_SDTNode =
         (_func_int **)
         &pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    pSVar5[2]._vptr_SDTNode =
         (_func_int **)
         &pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    pSVar5[3]._vptr_SDTNode = (_func_int **)0x0;
    pSVar5[3].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pSVar6 = (SDTNode *)operator_new(0x48);
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar6->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126be8;
    pSVar6[1]._vptr_SDTNode =
         (_func_int **)
         &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    pSVar6[2]._vptr_SDTNode = (_func_int **)0x0;
    pSVar7 = (SDTNode *)operator_new(0x28);
    (pSVar7->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar7->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar7->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar7[1]._vptr_SDTNode = (_func_int **)0x0;
    pSVar7->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126770;
    pvVar10 = &(this_00->super_SDTNode).sons;
    iVar11._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      auStack_c8._0_8_ = pSVar5;
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar11,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar11._M_current = pSVar5;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar11._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      auStack_c8._0_8_ = pSVar6;
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar11,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar11._M_current = pSVar6;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar11._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_c8._0_8_ = pSVar7;
    if (iVar11._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar11,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar11._M_current = pSVar7;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    inEval = 0;
    newLabel();
  case 5:
    auStack_c8._0_8_ = auStack_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_c8,"j","");
    sStack_a8._M_dataplus._M_p = (pointer)&sStack_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a8,"_","");
    sStack_88._M_dataplus._M_p = (pointer)&sStack_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_88,"_","");
    uVar2 = this_00->gotoNext;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_0010914f;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_0010914f;
        }
        if (uVar8 < 10000) goto LAB_0010914f;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_0010914f:
    sStack_68._M_dataplus._M_p = (pointer)&sStack_68.field_2;
    std::__cxx11::string::_M_construct((ulong)&sStack_68,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (sStack_68._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
    gen((string *)auStack_c8,&sStack_a8,&sStack_88,&sStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_68._M_dataplus._M_p != &sStack_68.field_2) {
      operator_delete(sStack_68._M_dataplus._M_p,sStack_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_88._M_dataplus._M_p != &sStack_88.field_2) {
      operator_delete(sStack_88._M_dataplus._M_p,sStack_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
      operator_delete(sStack_a8._M_dataplus._M_p,sStack_a8.field_2._M_allocated_capacity + 1);
    }
    if ((SDTNode *)auStack_c8._0_8_ == (SDTNode *)(auStack_c8 + 0x10)) {
      return;
    }
    break;
  case 6:
    pSVar5 = (SDTNode *)operator_new(0x68);
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar5->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar5->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126630;
    *(undefined4 *)&pSVar5[1]._vptr_SDTNode = 0;
    pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar5[1].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar5[2].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar5[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pSVar6 = (SDTNode *)operator_new(0x48);
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar6->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar6->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126730;
    pSVar6[1]._vptr_SDTNode =
         (_func_int **)
         &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
    pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined1 *)
     &pSVar6[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)&pSVar6[2]._vptr_SDTNode = 0;
    pvVar10 = &(this_00->super_SDTNode).sons;
    iVar3._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      auStack_c8._0_8_ = pSVar5;
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar3,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar3._M_current = pSVar5;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar3._M_current =
         (this_00->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_c8._0_8_ = pSVar6;
    if (iVar3._M_current ==
        (this_00->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)pvVar10,iVar3,
                 (SDTNode **)auStack_c8);
    }
    else {
      *iVar3._M_current = pSVar6;
      pppSVar1 = &(this_00->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    *(int *)&pSVar6[2]._vptr_SDTNode = this_00->gotoNext;
    (**pSVar5->_vptr_SDTNode)
              (pSVar5,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (((TreeNode *)iVar11._M_current)->sons).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[1],this_00);
    (**pSVar6->_vptr_SDTNode)
              (pSVar6,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (((TreeNode *)iVar11._M_current)->sons).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[2],this_00);
    return;
  default:
    goto switchD_00108d3b_default;
  }
  operator_delete((void *)auStack_c8._0_8_,auStack_c8._16_8_ + 1);
switchD_00108d3b_default:
  return;
}

Assistant:

void Stmt1::dfs(TreeNode &treeNode, SDT::SDTNode *fa) {
        if (treeNode.sons.empty()){
            writeLabel(gotoBegin);
            return;
        }
        Noelse *noelse = new Noelse;
        sons.push_back(noelse);
        writeLabel(gotoBegin);
        noelse->gotoNext = gotoNext;
        noelse->dfs(SON(1));
    }